

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<ProKey,ProFunctionDef>::emplace<ProFunctionDef_const&>
          (QHash<ProKey,ProFunctionDef> *this,ProKey *key,ProFunctionDef *args)

{
  Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *pDVar1;
  ProFile *pPVar2;
  long in_FS_OFFSET;
  piter pVar3;
  ProFunctionDef local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar2 = *(ProFile **)this;
  if (pPVar2 == (ProFile *)0x0) {
    local_38.m_pro = (ProFile *)0x0;
LAB_00289dab:
    pPVar2 = (ProFile *)0x0;
LAB_00289dcc:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::detached
                       ((Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)pPVar2);
    *(Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> **)this = pDVar1;
LAB_00289dd4:
    pVar3 = (piter)emplace_helper<ProFunctionDef_const&>(this,key,args);
    QHash<ProKey,_ProFunctionDef>::~QHash((QHash<ProKey,_ProFunctionDef> *)&local_38);
  }
  else {
    if (1 < (uint)(((RefCount *)&pPVar2->m_refCount)->atomic)._q_value.super___atomic_base<int>._M_i
       ) {
      local_38.m_pro = pPVar2;
      if ((((RefCount *)&pPVar2->m_refCount)->atomic)._q_value.super___atomic_base<int>._M_i != -1)
      {
        LOCK();
        (((RefCount *)&pPVar2->m_refCount)->atomic)._q_value.super___atomic_base<int>._M_i =
             (((RefCount *)&pPVar2->m_refCount)->atomic)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pPVar2 = *(ProFile **)this;
        if (pPVar2 == (ProFile *)0x0) goto LAB_00289dab;
      }
      if (1 < (uint)(((RefCount *)&pPVar2->m_refCount)->atomic)._q_value.super___atomic_base<int>.
                    _M_i) goto LAB_00289dcc;
      goto LAB_00289dd4;
    }
    if ((pPVar2->m_proitems).d.d < (Data *)((ulong)(pPVar2->m_proitems).d.ptr >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<ProFunctionDef_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_00289e4b;
    }
    local_38.m_pro = args->m_pro;
    local_38.m_offset = args->m_offset;
    ((local_38.m_pro)->m_refCount).m_cnt = ((local_38.m_pro)->m_refCount).m_cnt + 1;
    pVar3 = (piter)QHash<ProKey,_ProFunctionDef>::emplace_helper<ProFunctionDef>
                             ((QHash<ProKey,_ProFunctionDef> *)this,key,&local_38);
    if (local_38.m_pro != (ProFile *)0x0) {
      ProFile::deref(local_38.m_pro);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_00289e4b:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }